

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * extractFileExt(string *__return_storage_ptr__,string *src)

{
  char *pcVar1;
  ulong uVar2;
  allocator<char> local_51;
  undefined4 local_50;
  string local_40 [8];
  string rez;
  size_t i;
  string *src_local;
  
  rez.field_2._8_8_ = std::__cxx11::string::size();
  do {
    rez.field_2._8_8_ = rez.field_2._8_8_ + -1;
    if (rez.field_2._8_8_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_51);
      std::allocator<char>::~allocator(&local_51);
      return __return_storage_ptr__;
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)src);
  } while (*pcVar1 != '.');
  std::__cxx11::string::substr((ulong)local_40,(ulong)src);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::size();
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar1 == '\"') {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_40);
      goto LAB_00389937;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
LAB_00389937:
  local_50 = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

string extractFileExt(const string& src)
{
    for (size_t i = src.size() - 1; i > 0; i--)
        if (src[i] == '.')
        {
            string rez = src.substr(i + 1);
            if (!rez.empty() && rez[rez.size() - 1] == '\"')
                return rez.substr(0, rez.size() - 1);
            return rez;
        }
    return "";
}